

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepTiledInputFile::rawTileData
          (DeepTiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char *pixelData,
          uint64_t *pixelDataSize)

{
  IStream *pIVar1;
  ulong uVar2;
  InputStreamMutex *pIVar3;
  bool bVar4;
  int iVar5;
  ArgExc *pAVar6;
  uint64_t *puVar7;
  ostream *poVar8;
  InputExc *pIVar9;
  undefined4 extraout_var;
  ulong uVar10;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  DeepTiledInputFile *in_RDI;
  int *in_R8;
  int *in_R9;
  ulong *in_stack_00000008;
  bool big_enough;
  uint64_t totalSizeRequired;
  uint64_t packedDataSize;
  uint64_t sampleCountTableSize;
  stringstream _iex_throw_s_1;
  int partNumber;
  int levelY;
  int levelX;
  int tileYCoord;
  int tileXCoord;
  lock_guard<std::mutex> lock;
  stringstream _iex_throw_s;
  uint64_t tileOffset;
  mutex_type *in_stack_fffffffffffffba8;
  undefined6 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb6;
  undefined1 in_stack_fffffffffffffbb7;
  undefined8 in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbd0;
  TileOffsets *in_stack_fffffffffffffbd8;
  int local_388;
  undefined4 uStack_384;
  int local_380;
  undefined4 uStack_37c;
  stringstream local_378 [16];
  ostream local_368 [380];
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  stringstream local_1d0 [16];
  ostream local_1c0 [376];
  uint64_t local_48;
  int *local_30;
  int *local_28;
  int *local_20;
  int *local_18;
  int *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar4 = isValidTile(in_RDI,*in_RSI,*in_RDX,*in_RCX,*in_R8);
  if (!bVar4) {
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar6,"Tried to read a tile outside the image file\'s data window.");
    __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  puVar7 = TileOffsets::operator()
                     (in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                      (int)in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20)
                      ,(int)in_stack_fffffffffffffbc8);
  local_48 = *puVar7;
  if (local_48 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1d0);
    poVar8 = std::operator<<(local_1c0,"Tile (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*local_10);
    poVar8 = std::operator<<(poVar8,", ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*local_18);
    poVar8 = std::operator<<(poVar8,", ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*local_20);
    poVar8 = std::operator<<(poVar8,", ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*local_28);
    std::operator<<(poVar8,") is missing.");
    pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar9,local_1d0);
    __cxa_throw(pIVar9,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffbb7,
                      CONCAT16(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0)),
             in_stack_fffffffffffffba8);
  iVar5 = (*in_RDI->_data->_streamData->is->_vptr_IStream[5])();
  if (CONCAT44(extraout_var,iVar5) != local_48) {
    pIVar1 = in_RDI->_data->_streamData->is;
    (*pIVar1->_vptr_IStream[6])(pIVar1,local_48);
  }
  bVar4 = isMultiPart(in_RDI->_data->version);
  if ((bVar4) &&
     (Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
                ((IStream *)
                 CONCAT17(in_stack_fffffffffffffbb7,
                          CONCAT16(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0)),
                 (int *)in_stack_fffffffffffffba8), local_1ec != in_RDI->_data->partNumber)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_378);
    poVar8 = std::operator<<(local_368,"Unexpected part number ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1ec);
    poVar8 = std::operator<<(poVar8,", should be ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,in_RDI->_data->partNumber);
    std::operator<<(poVar8,".");
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar6,local_378);
    __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
            ((IStream *)
             CONCAT17(in_stack_fffffffffffffbb7,
                      CONCAT16(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0)),
             (int *)in_stack_fffffffffffffba8);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
            ((IStream *)
             CONCAT17(in_stack_fffffffffffffbb7,
                      CONCAT16(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0)),
             (int *)in_stack_fffffffffffffba8);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
            ((IStream *)
             CONCAT17(in_stack_fffffffffffffbb7,
                      CONCAT16(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0)),
             (int *)in_stack_fffffffffffffba8);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
            ((IStream *)
             CONCAT17(in_stack_fffffffffffffbb7,
                      CONCAT16(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0)),
             (int *)in_stack_fffffffffffffba8);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
            ((IStream *)
             CONCAT17(in_stack_fffffffffffffbb7,
                      CONCAT16(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0)),
             (uint64_t *)in_stack_fffffffffffffba8);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
            ((IStream *)
             CONCAT17(in_stack_fffffffffffffbb7,
                      CONCAT16(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0)),
             (uint64_t *)in_stack_fffffffffffffba8);
  if (local_1dc != *local_10) {
    pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar9,"Unexpected tile x coordinate.");
    __cxa_throw(pIVar9,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  if (local_1e0 == *local_18) {
    if (local_1e4 != *local_20) {
      pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::InputExc::InputExc(pIVar9,"Unexpected tile x level number coordinate.");
      __cxa_throw(pIVar9,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
    }
    if (local_1e8 == *local_28) {
      uVar10 = CONCAT44(uStack_37c,local_380) + 0x28 + CONCAT44(uStack_384,local_388);
      uVar2 = *in_stack_00000008;
      *in_stack_00000008 = uVar10;
      if ((uVar2 < uVar10) || (local_30 == (int *)0x0)) {
        bVar4 = isMultiPart(in_RDI->_data->version);
        if (!bVar4) {
          pIVar3 = in_RDI->_data->_streamData;
          pIVar1 = pIVar3->is;
          (*pIVar1->_vptr_IStream[6])(pIVar1,pIVar3->currentPosition);
        }
      }
      else {
        *local_30 = *local_10;
        local_30[1] = *local_18;
        local_30[2] = local_1e4;
        local_30[3] = local_1e8;
        *(ulong *)(local_30 + 4) = CONCAT44(uStack_37c,local_380);
        *(ulong *)(local_30 + 6) = CONCAT44(uStack_384,local_388);
        Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
                  ((IStream *)
                   CONCAT17(in_stack_fffffffffffffbb7,
                            CONCAT16(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0)),
                   (uint64_t *)in_stack_fffffffffffffba8);
        pIVar1 = in_RDI->_data->_streamData->is;
        (*pIVar1->_vptr_IStream[3])(pIVar1,local_30 + 10,(ulong)(uint)(local_380 + local_388));
        bVar4 = isMultiPart(in_RDI->_data->version);
        if (!bVar4) {
          pIVar3 = in_RDI->_data->_streamData;
          pIVar3->currentPosition =
               CONCAT44(uStack_37c,local_380) + CONCAT44(uStack_384,local_388) + 0x28 +
               pIVar3->currentPosition;
        }
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b0600);
      return;
    }
    pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar9,"Unexpected tile y level number coordinate.");
    __cxa_throw(pIVar9,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(pIVar9,"Unexpected tile y coordinate.");
  __cxa_throw(pIVar9,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

void
DeepTiledInputFile::rawTileData (
    int&      dx,
    int&      dy,
    int&      lx,
    int&      ly,
    char*     pixelData,
    uint64_t& pixelDataSize) const
{
    if (!isValidTile (dx, dy, lx, ly))
        throw IEX_NAMESPACE::ArgExc ("Tried to read a tile outside "
                                     "the image file's data window.");

    uint64_t tileOffset = _data->tileOffsets (dx, dy, lx, ly);

    if (tileOffset == 0)
    {
        THROW (
            IEX_NAMESPACE::InputExc,
            "Tile (" << dx << ", " << dy << ", " << lx << ", " << ly
                     << ") is missing.");
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    if (_data->_streamData->is->tellg () != tileOffset)
        _data->_streamData->is->seekg (tileOffset);

    //
    // Read the first few bytes of the tile (the header).
    // Verify that the tile coordinates and the level number
    // are correct.
    //

    int tileXCoord, tileYCoord, levelX, levelY;

    if (isMultiPart (_data->version))
    {
        int partNumber;
        Xdr::read<StreamIO> (*_data->_streamData->is, partNumber);
        if (partNumber != _data->partNumber)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Unexpected part number " << partNumber << ", should be "
                                          << _data->partNumber << ".");
        }
    }

    Xdr::read<StreamIO> (*_data->_streamData->is, tileXCoord);
    Xdr::read<StreamIO> (*_data->_streamData->is, tileYCoord);
    Xdr::read<StreamIO> (*_data->_streamData->is, levelX);
    Xdr::read<StreamIO> (*_data->_streamData->is, levelY);

    uint64_t sampleCountTableSize;
    uint64_t packedDataSize;
    Xdr::read<StreamIO> (*_data->_streamData->is, sampleCountTableSize);

    Xdr::read<StreamIO> (*_data->_streamData->is, packedDataSize);

    if (tileXCoord != dx)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile x coordinate.");

    if (tileYCoord != dy)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile y coordinate.");

    if (levelX != lx)
        throw IEX_NAMESPACE::InputExc (
            "Unexpected tile x level number coordinate.");

    if (levelY != ly)
        throw IEX_NAMESPACE::InputExc (
            "Unexpected tile y level number coordinate.");

    // total requirement for reading all the data

    uint64_t totalSizeRequired = 40 + sampleCountTableSize + packedDataSize;

    bool big_enough = totalSizeRequired <= pixelDataSize;

    pixelDataSize = totalSizeRequired;

    // was the block we were given big enough?
    if (!big_enough || pixelData == NULL)
    {
        // special case: seek stream back to start if we are at the beginning (regular reading pixels assumes it doesn't need to seek
        // in single part files)
        if (!isMultiPart (_data->version))
        {
            _data->_streamData->is->seekg (_data->_streamData->currentPosition);
        }
        // leave lock here - bail before reading more data
        return;
    }

    // copy the values we have read into the output block
    *(int*) (pixelData + 0)       = dx;
    *(int*) (pixelData + 4)       = dy;
    *(int*) (pixelData + 8)       = levelX;
    *(int*) (pixelData + 12)      = levelY;
    *(uint64_t*) (pixelData + 16) = sampleCountTableSize;
    *(uint64_t*) (pixelData + 24) = packedDataSize;

    // didn't read the unpackedsize - do that now
    Xdr::read<StreamIO> (
        *_data->_streamData->is, *(uint64_t*) (pixelData + 32));

    // read the actual data
    _data->_streamData->is->read (
        pixelData + 40,
        static_cast<int> (sampleCountTableSize + packedDataSize));

    if (!isMultiPart (_data->version))
    {
        _data->_streamData->currentPosition +=
            sampleCountTableSize + packedDataSize + 40;
    }

    // leave lock here
}